

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O1

double crnlib::image_utils::compute_std_dev
                 (uint n,color_quad_u8 *pPixels,uint first_channel,uint num_channels)

{
  color_quad_u8 *pcVar1;
  byte bVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  if (n == 0) {
    return 0.0;
  }
  dVar7 = 0.0;
  uVar3 = 0;
  dVar6 = 0.0;
  do {
    pcVar1 = pPixels + uVar3;
    uVar5 = (ulong)num_channels;
    uVar4 = first_channel;
    if (num_channels == 0) {
      uVar4 = (uint)(pcVar1->field_0).field_0.b * 0x1d2f +
              (uint)(pcVar1->field_0).field_0.g * 0x9646 +
              (uint)(pcVar1->field_0).field_0.r * 0x4c8b + 0x8000 >> 0x10;
      dVar7 = dVar7 + (double)uVar4;
      dVar6 = dVar6 + (double)(uVar4 * uVar4);
    }
    else {
      do {
        bVar2 = (pcVar1->field_0).c[uVar4];
        dVar7 = dVar7 + (double)bVar2;
        dVar6 = dVar6 + (double)((uint)bVar2 * (uint)bVar2);
        uVar5 = uVar5 - 1;
        uVar4 = uVar4 + 1;
      } while (uVar5 != 0);
    }
    uVar3 = uVar3 + 1;
  } while (uVar3 != n);
  dVar8 = (double)((num_channels + (num_channels == 0)) * n);
  dVar7 = dVar7 / dVar8;
  dVar6 = dVar6 / dVar8 - dVar7 * dVar7;
  if (dVar6 <= 0.0) {
    dVar6 = 0.0;
  }
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
    return dVar6;
  }
  return SQRT(dVar6);
}

Assistant:

double compute_std_dev(uint n, const color_quad_u8* pPixels, uint first_channel, uint num_channels)
        {
            if (!n)
            {
                return 0.0f;
            }

            double sum = 0.0f;
            double sum2 = 0.0f;

            for (uint i = 0; i < n; i++)
            {
                const color_quad_u8& cp = pPixels[i];

                if (!num_channels)
                {
                    uint l = cp.get_luma();
                    sum += l;
                    sum2 += l * l;
                }
                else
                {
                    for (uint c = 0; c < num_channels; c++)
                    {
                        uint l = cp[first_channel + c];
                        sum += l;
                        sum2 += l * l;
                    }
                }
            }

            double w = math::maximum(1U, num_channels) * n;
            sum /= w;
            sum2 /= w;

            double var = sum2 - sum * sum;
            var = math::maximum<double>(var, 0.0f);

            return sqrt(var);
        }